

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateAttachmentStates
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 SubpassIndex)

{
  ITextureView *pIVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  RESOURCE_STATE State;
  RenderPassVkImpl *pRVar5;
  Char *pCVar6;
  FramebufferVkImpl *pFVar7;
  RenderPassDesc *Args_1;
  FramebufferDesc *pFVar8;
  RenderDeviceVkImpl *this_00;
  RenderDeviceInfo *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureVkImpl *this_02;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  RESOURCE_STATE CurrState;
  TextureImplType *pTex;
  ITextureView *pView;
  Uint32 i;
  bool IsMetal;
  string msg_3;
  string msg_2;
  FramebufferDesc *FBDesc;
  RenderPassDesc *RPDesc;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Uint32 SubpassIndex_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  if (this->m_RenderPassAttachmentsTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
    msg.field_2._12_4_ = SubpassIndex;
    pRVar5 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                       ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
    if (pRVar5 == (RenderPassVkImpl *)0x0) {
      FormatString<char[31]>((string *)local_38,(char (*) [31])"There is no active render pass");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5ff);
      std::__cxx11::string::~string((string *)local_38);
    }
    pFVar7 = Diligent::RefCntAutoPtr::operator_cast_to_FramebufferVkImpl_
                       ((RefCntAutoPtr *)&this->m_pBoundFramebuffer);
    if (pFVar7 == (FramebufferVkImpl *)0x0) {
      FormatString<char[31]>((string *)&RPDesc,(char (*) [31])"There is no active framebuffer");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x600);
      std::__cxx11::string::~string((string *)&RPDesc);
    }
    pRVar5 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator->(&this->m_pActiveRenderPass);
    Args_1 = DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                        *)pRVar5);
    pFVar7 = RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator->(&this->m_pBoundFramebuffer);
    pFVar8 = DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                        *)pFVar7);
    if (pFVar8->AttachmentCount != Args_1->AttachmentCount) {
      FormatString<char[31],unsigned_int,char[60],unsigned_int,char[2]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Framebuffer attachment count (",
                 (char (*) [31])&pFVar8->AttachmentCount,
                 (uint *)") is not consistent with the render pass attachment count (",
                 (char (*) [60])&Args_1->AttachmentCount,(uint *)0xf65f2d,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x605);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    if (Args_1->SubpassCount < (uint)msg.field_2._12_4_) {
      FormatString<char[26],char[36]>
                ((string *)&i,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SubpassIndex <= RPDesc.SubpassCount",(char (*) [36])Args_1);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x606);
      std::__cxx11::string::~string((string *)&i);
    }
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
    this_01 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                        ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
    bVar2 = RenderDeviceInfo::IsMetalDevice(this_01);
    for (pView._0_4_ = 0; (uint)pView < Args_1->AttachmentCount; pView._0_4_ = (uint)pView + 1) {
      pIVar1 = pFVar8->ppAttachments[(uint)pView];
      if ((pIVar1 != (ITextureView *)0x0) &&
         ((!bVar2 ||
          (iVar4 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
          *(char *)(CONCAT44(extraout_var,iVar4) + 8) != '\x06')))) {
        iVar4 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[10])();
        this_02 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>
                            ((ITexture *)CONCAT44(extraout_var_00,iVar4));
        bVar3 = TextureBase<Diligent::EngineVkImplTraits>::IsInKnownState
                          (&this_02->super_TextureBase<Diligent::EngineVkImplTraits>);
        if (bVar3) {
          if ((uint)msg.field_2._12_4_ < Args_1->SubpassCount) {
            pRVar5 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator->
                               (&this->m_pActiveRenderPass);
            State = RenderPassBase<Diligent::EngineVkImplTraits>::GetAttachmentState
                              (&pRVar5->super_RenderPassBase<Diligent::EngineVkImplTraits>,
                               msg.field_2._12_4_,(uint)pView);
          }
          else {
            State = Args_1->pAttachments[(uint)pView].FinalState;
          }
          TextureBase<Diligent::EngineVkImplTraits>::SetState
                    (&this_02->super_TextureBase<Diligent::EngineVkImplTraits>,State);
        }
      }
    }
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateAttachmentStates(Uint32 SubpassIndex)
{
    if (m_RenderPassAttachmentsTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
        return;

    DEV_CHECK_ERR(m_pActiveRenderPass != nullptr, "There is no active render pass");
    DEV_CHECK_ERR(m_pBoundFramebuffer != nullptr, "There is no active framebuffer");

    const RenderPassDesc&  RPDesc = m_pActiveRenderPass->GetDesc();
    const FramebufferDesc& FBDesc = m_pBoundFramebuffer->GetDesc();
    VERIFY(FBDesc.AttachmentCount == RPDesc.AttachmentCount,
           "Framebuffer attachment count (", FBDesc.AttachmentCount, ") is not consistent with the render pass attachment count (", RPDesc.AttachmentCount, ")");
    VERIFY_EXPR(SubpassIndex <= RPDesc.SubpassCount);
    const bool IsMetal = m_pDevice->GetDeviceInfo().IsMetalDevice();
    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        if (ITextureView* pView = FBDesc.ppAttachments[i])
        {
            if (IsMetal && pView->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            TextureImplType* pTex = ClassPtrCast<TextureImplType>(pView->GetTexture());
            if (pTex->IsInKnownState())
            {
                RESOURCE_STATE CurrState = SubpassIndex < RPDesc.SubpassCount ?
                    m_pActiveRenderPass->GetAttachmentState(SubpassIndex, i) :
                    RPDesc.pAttachments[i].FinalState;
                pTex->SetState(CurrState);
            }
        }
    }
}